

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

RefPtr<wabt::interp::DefinedFunc> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
          (RefPtr<wabt::interp::DefinedFunc> *__return_storage_ptr__,Store *this,Store *args,
          Ref *args_1,FuncDesc *args_2)

{
  DefinedFunc *this_00;
  Ref RVar1;
  Store *store;
  DefinedFunc *local_b0;
  FuncDesc local_a8;
  
  this_00 = (DefinedFunc *)operator_new(0x100);
  RVar1 = (Ref)args_1->index;
  local_a8.type.super_ExternType.kind = (args_2->type).super_ExternType.kind;
  local_a8.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_0022c890;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&local_a8.type.params,&(args_2->type).params);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&local_a8.type.results,&(args_2->type).results);
  std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
            (&local_a8.locals,&args_2->locals);
  local_a8.code_offset = args_2->code_offset;
  store = (Store *)&args_2->handlers;
  std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
            (&local_a8.handlers,
             (vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)store)
  ;
  DefinedFunc::DefinedFunc(this_00,store,RVar1,&local_a8);
  local_b0 = this_00;
  RVar1.index = FreeList<wabt::interp::Object*>::New<wabt::interp::DefinedFunc*>
                          ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_b0);
  std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
            (&local_a8.handlers);
  if (local_a8.locals.
      super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.locals.
                    super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.locals.
                          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.locals.
                          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_a8.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_0022c890;
  if (local_a8.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.type.results.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.type.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.type.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.type.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.type.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  RefPtr<wabt::interp::DefinedFunc>::RefPtr(__return_storage_ptr__,this,RVar1);
  (__return_storage_ptr__->obj_->super_Func).super_Extern.super_Object.self_.index = RVar1.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}